

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O2

QUrl __thiscall
QNetworkRequestFactoryPrivate::requestUrl
          (QNetworkRequestFactoryPrivate *this,QString *path,QUrlQuery *query)

{
  qsizetype *pqVar1;
  long lVar2;
  char cVar3;
  ParsingMode PVar4;
  undefined8 uVar5;
  QUrlQuery *in_RCX;
  QList<std::pair<QString,_QString>_> *__range2;
  long lVar6;
  pair<QString,_QString> *item;
  type *key;
  QString *pQVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<QString,_QString>_> local_b8;
  QUrlQuery pathQueryItems;
  QUrlQuery resultQuery;
  QArrayDataPointer<char16_t> local_88;
  char *local_70;
  QArrayDataPointer<char16_t> local_68;
  QUrlQuery providedQuery;
  QUrl providedPath;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  providedPath.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  if (query == (QUrlQuery *)0x0) {
    QUrl::QUrl(&providedPath);
  }
  else {
    QUrl::QUrl(&providedPath,(QString *)query,TolerantMode);
  }
  _providedQuery = &DAT_aaaaaaaaaaaaaaaa;
  if (in_RCX == (QUrlQuery *)0x0) {
    QUrlQuery::QUrlQuery(&providedQuery);
  }
  else {
    QUrlQuery::QUrlQuery(&providedQuery,in_RCX);
  }
  QUrl::scheme();
  if (CONCAT44(local_88.size._4_4_,(undefined4)local_88.size) == 0) {
    QUrl::host(&local_68,&providedPath,0x7f00000);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    if (local_68.size != 0) goto LAB_00204d64;
  }
  else {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
LAB_00204d64:
    lcQrequestfactory();
    if (((byte)lcQrequestfactory::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
        != 0) {
      local_88.d._0_4_ = 2;
      local_88._4_8_ = 0;
      local_88.ptr._4_4_ = 0;
      local_88.size._0_4_ = 0;
      local_88.size._4_4_ = 0;
      local_70 = lcQrequestfactory::category.name;
      QUrl::toDisplayString(&local_68,&providedPath,0);
      uVar5 = QString::utf16();
      QMessageLogger::warning
                ((char *)&local_88,
                 "The provided path %ls may only contain path and query item components, and other parts will be ignored. Set the baseUrl instead"
                 ,uVar5);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    }
  }
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  pqVar1 = &(path->d).size;
  QUrl::QUrl((QUrl *)this,(QUrl *)pqVar1);
  _resultQuery = &DAT_aaaaaaaaaaaaaaaa;
  QUrlQuery::QUrlQuery(&resultQuery,&providedQuery);
  local_88.size._0_4_ = 0xaaaaaaaa;
  local_88.size._4_4_ = 0xaaaaaaaa;
  local_88.d._0_4_ = 0xaaaaaaaa;
  local_88._4_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr._4_4_ = 0xaaaaaaaa;
  QUrl::path(&local_88,pqVar1,0x7f00000);
  QUrl::setUserName((QString *)this,(int)path + 0x38);
  QUrl::setPassword((QString *)this,(int)path + 0x50);
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d._0_4_ = 0xaaaaaaaa;
  local_68.d._4_4_ = 0xaaaaaaaa;
  local_68.ptr._0_4_ = 0xaaaaaaaa;
  local_68.ptr._4_4_ = 0xaaaaaaaa;
  QUrl::path(&local_68,&providedPath,0x7f00000);
  _pathQueryItems = &DAT_aaaaaaaaaaaaaaaa;
  QUrlQuery::QUrlQuery(&pathQueryItems,&providedPath);
  cVar3 = QUrlQuery::isEmpty();
  if (cVar3 == '\0') {
    local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d._0_4_ = 0xaaaaaaaa;
    local_b8.d._4_4_ = 0xaaaaaaaa;
    local_b8.ptr._0_4_ = 0xaaaaaaaa;
    local_b8.ptr._4_4_ = 0xaaaaaaaa;
    QUrlQuery::queryItems(&local_b8,&pathQueryItems,0x1f00000);
    pQVar7 = (QString *)CONCAT44(local_b8.ptr._4_4_,local_b8.ptr._0_4_);
    for (lVar6 = local_b8.size * 0x30; lVar6 != 0; lVar6 = lVar6 + -0x30) {
      QUrlQuery::addQueryItem((QString *)&resultQuery,pQVar7);
      pQVar7 = pQVar7 + 0x30;
    }
    QArrayDataPointer<std::pair<QString,_QString>_>::~QArrayDataPointer(&local_b8);
  }
  cVar3 = QUrlQuery::isEmpty();
  if (cVar3 == '\0') {
    local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d._0_4_ = 0xaaaaaaaa;
    local_b8.d._4_4_ = 0xaaaaaaaa;
    local_b8.ptr._0_4_ = 0xaaaaaaaa;
    local_b8.ptr._4_4_ = 0xaaaaaaaa;
    QUrlQuery::queryItems(&local_b8,&path[4].d.ptr,0x1f00000);
    pQVar7 = (QString *)CONCAT44(local_b8.ptr._4_4_,local_b8.ptr._0_4_);
    for (lVar6 = local_b8.size * 0x30; lVar6 != 0; lVar6 = lVar6 + -0x30) {
      QUrlQuery::addQueryItem((QString *)&resultQuery,pQVar7);
      pQVar7 = pQVar7 + 0x30;
    }
    QArrayDataPointer<std::pair<QString,_QString>_>::~QArrayDataPointer(&local_b8);
  }
  cVar3 = QUrlQuery::isEmpty();
  if (cVar3 == '\0') {
    QUrl::setQuery((QUrlQuery *)this);
  }
  if ((undefined1 *)local_68.size == (undefined1 *)0x0) goto LAB_00204f91;
  cVar3 = QString::endsWith((QChar)(char16_t)&local_88,0x2f);
  if (cVar3 == '\0') {
LAB_00204f3f:
    cVar3 = QString::startsWith((QChar)(char16_t)&local_68,0x2f);
    if (cVar3 == '\0') {
      cVar3 = QString::endsWith((QChar)(char16_t)&local_88,0x2f);
      if (cVar3 == '\0') {
        QString::append((QChar)(char16_t)&local_88);
      }
    }
  }
  else {
    cVar3 = QString::startsWith((QChar)(char16_t)&local_68,0x2f);
    if (cVar3 == '\0') goto LAB_00204f3f;
    QString::chop((longlong)&local_88);
  }
  PVar4 = QString::append((QString *)&local_88);
  QUrl::setPath((QString *)this,PVar4);
LAB_00204f91:
  QUrlQuery::~QUrlQuery(&pathQueryItems);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QUrlQuery::~QUrlQuery(&resultQuery);
  QUrlQuery::~QUrlQuery(&providedQuery);
  QUrl::~QUrl(&providedPath);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (QUrl)(QUrlPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QUrl QNetworkRequestFactoryPrivate::requestUrl(const QString *path,
                                             const QUrlQuery *query) const
{
    const QUrl providedPath = path ? QUrl(*path) : QUrl{};
    const QUrlQuery providedQuery = query ? *query : QUrlQuery();

    if (!providedPath.scheme().isEmpty() || !providedPath.host().isEmpty()) {
        qCWarning(lcQrequestfactory, "The provided path %ls may only contain path and query item "
                  "components, and other parts will be ignored. Set the baseUrl instead",
                  qUtf16Printable(providedPath.toDisplayString()));
    }

    QUrl resultUrl = baseUrl;
    QUrlQuery resultQuery(providedQuery);
    QString basePath = baseUrl.path();

    resultUrl.setUserName(userName);
    resultUrl.setPassword(password);

    // Separate the path and query parameters components on the application-provided path
    const QString requestPath{providedPath.path()};
    const QUrlQuery pathQueryItems{providedPath};

    if (!pathQueryItems.isEmpty()) {
        // Add any query items provided as part of the path
        const auto items = pathQueryItems.queryItems(QUrl::ComponentFormattingOption::FullyEncoded);
        for (const auto &[key, value]: items)
            resultQuery.addQueryItem(key, value);
    }

    if (!queryParameters.isEmpty()) {
        // Add any query items set to this factory
        const QList<std::pair<QString,QString>> items =
                queryParameters.queryItems(QUrl::ComponentFormattingOption::FullyEncoded);
        for (const auto &item: items)
            resultQuery.addQueryItem(item.first, item.second);
    }

    if (!resultQuery.isEmpty())
        resultUrl.setQuery(resultQuery);

    if (requestPath.isEmpty())
        return resultUrl;

    // Ensure that the "base path" (the path that may be present
    // in the baseUrl), and the request path are joined with one '/'
    // If both have it, remove one, if neither has it, add one
    if (basePath.endsWith(u'/') && requestPath.startsWith(u'/'))
        basePath.chop(1);
    else if (!requestPath.startsWith(u'/') && !basePath.endsWith(u'/'))
        basePath.append(u'/');

    resultUrl.setPath(basePath.append(requestPath));
    return resultUrl;
}